

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

slice_instructions *
llava_uhd::get_slice_instructions
          (slice_instructions *__return_storage_ptr__,clip_ctx *ctx,clip_image_size *original_size)

{
  pointer *ppsVar1;
  int *piVar2;
  iterator iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  clip_image_size cVar7;
  clip_image_size cVar8;
  int iVar9;
  clip_image_size cVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  clip_image_size best_grid;
  slice_coordinates slice;
  clip_image_size local_80;
  slice_coordinates local_78;
  slice_instructions *local_68;
  undefined8 uStack_60;
  ulong local_58;
  vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>> *local_50;
  undefined8 local_48;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->slices).
           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->slices).
           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->slices).
  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->slices).
  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar9 = (ctx->vision_model).hparams.image_size;
  iVar16 = 0;
  if (ctx->has_minicpmv_projector == true) {
    iVar16 = (uint)(ctx->minicpmv_version != 0) * 9;
  }
  local_50 = (vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>> *)
             &__return_storage_ptr__->slices;
  iVar14 = (ctx->vision_model).hparams.patch_size;
  fVar17 = (float)(*original_size).width;
  fStack_40 = (float)(*original_size).height;
  local_68 = (slice_instructions *)CONCAT44(fStack_40,fVar17);
  uStack_60 = 0;
  local_48 = CONCAT44(fStack_40,fStack_40);
  fStack_3c = fStack_40;
  fVar17 = logf(fVar17 / fStack_40);
  local_58 = CONCAT44(local_58._4_4_,fVar17);
  fVar17 = ceilf(((float)local_48 * local_68._0_4_) / (float)(iVar9 * iVar9));
  local_68 = __return_storage_ptr__;
  if ((ctx->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (ctx->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((float)iVar16 <= fVar17) {
      fVar17 = (float)iVar16;
    }
    iVar15 = (int)fVar17;
    cVar10 = get_best_resize(original_size,iVar9,iVar14,1 < iVar15);
    __return_storage_ptr__->overview_size = cVar10;
    if (iVar15 < 2) {
      (__return_storage_ptr__->refined_size).width = 0;
      (__return_storage_ptr__->refined_size).height = 0;
      (__return_storage_ptr__->grid_size).width = 0;
      (__return_storage_ptr__->grid_size).height = 0;
    }
    else {
      local_80 = get_best_grid(iVar16,iVar15,(float)local_58);
      cVar10 = get_refine_size(original_size,&local_80,iVar9,iVar14,true);
      local_58 = (ulong)cVar10 >> 0x20;
      __return_storage_ptr__->grid_size = local_80;
      iVar16 = cVar10.width;
      (__return_storage_ptr__->refined_size).width = iVar16;
      iVar9 = cVar10.height;
      (__return_storage_ptr__->refined_size).height = iVar9;
      lVar5 = (long)local_80.width;
      lVar6 = (long)local_80.height;
      uVar11 = (ulong)(uint)(iVar9 >> 0x1f) << 0x20 | local_58;
      __return_storage_ptr__ = local_68;
      if (0 < local_80.height && (iVar9 != 0 && -1 < (long)cVar10)) {
        iVar9 = 0;
        iVar14 = 0;
        do {
          local_48 = CONCAT44(local_48._4_4_,iVar9);
          iVar9 = (int)((long)uVar11 / lVar6);
          if ((0 < iVar16) && (0 < local_80.width)) {
            iVar13 = 0;
            iVar15 = 1;
            do {
              iVar12 = (int)((long)((ulong)(uint)(iVar16 >> 0x1f) << 0x20 |
                                   (ulong)cVar10 & 0xffffffff) / lVar5);
              iVar3._M_current =
                   (local_68->slices).
                   super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (local_68->slices).
                  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_78.x = iVar13;
                local_78.y = iVar14;
                local_78.size.width = iVar12;
                local_78.size.height = iVar9;
                std::
                vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>>::
                _M_realloc_insert<llava_uhd::slice_coordinates_const&>(local_50,iVar3,&local_78);
              }
              else {
                cVar8.height = iVar9;
                cVar8.width = iVar12;
                (iVar3._M_current)->x = iVar13;
                (iVar3._M_current)->y = iVar14;
                (iVar3._M_current)->size = cVar8;
                ppsVar1 = &(local_68->slices).
                           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppsVar1 = *ppsVar1 + 1;
              }
              iVar13 = iVar13 + iVar12;
              if (iVar16 <= iVar13) break;
              bVar4 = iVar15 < local_80.width;
              iVar15 = iVar15 + 1;
            } while (bVar4);
          }
          iVar14 = iVar14 + iVar9;
          if ((int)(float)local_58 <= iVar14) {
            return local_68;
          }
          iVar9 = (int)(float)local_48 + 1;
          __return_storage_ptr__ = local_68;
        } while (iVar9 < local_80.height);
      }
    }
  }
  else {
    cVar10 = select_best_resolution(&(ctx->vision_model).hparams.image_grid_pinpoints,original_size)
    ;
    local_48 = (ulong)cVar10 >> 0x20;
    (__return_storage_ptr__->overview_size).width = iVar9;
    (__return_storage_ptr__->overview_size).height = iVar9;
    iVar16 = cVar10.width;
    (__return_storage_ptr__->refined_size).width = iVar16;
    (__return_storage_ptr__->refined_size).height = cVar10.height;
    (__return_storage_ptr__->grid_size).width = 0;
    (__return_storage_ptr__->grid_size).height = 0;
    __return_storage_ptr__->padding_refined = true;
    if (0 < cVar10.height) {
      iVar14 = 0;
      do {
        if (0 < iVar16) {
          iVar15 = (int)local_48 - iVar14;
          if (iVar9 <= iVar15) {
            iVar15 = iVar9;
          }
          iVar13 = 0;
          uVar11 = (ulong)cVar10 & 0xffffffff;
          do {
            local_78.size.width = (int)uVar11;
            uVar11 = (ulong)(uint)(local_78.size.width - iVar9);
            if (iVar9 <= local_78.size.width) {
              local_78.size.width = iVar9;
            }
            iVar3._M_current =
                 (local_68->slices).
                 super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (local_68->slices).
                super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_78.x = iVar13;
              local_78.y = iVar14;
              local_78.size.height = iVar15;
              std::vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>>
              ::_M_realloc_insert<llava_uhd::slice_coordinates_const&>(local_50,iVar3,&local_78);
            }
            else {
              cVar7.height = iVar15;
              cVar7.width = local_78.size.width;
              (iVar3._M_current)->x = iVar13;
              (iVar3._M_current)->y = iVar14;
              (iVar3._M_current)->size = cVar7;
              ppsVar1 = &(local_68->slices).
                         super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
            if (iVar13 == 0) {
              (local_68->grid_size).width = (local_68->grid_size).width + 1;
            }
            iVar13 = iVar13 + iVar9;
          } while (iVar13 < iVar16);
        }
        piVar2 = &(local_68->grid_size).height;
        *piVar2 = *piVar2 + 1;
        iVar14 = iVar14 + iVar9;
        __return_storage_ptr__ = local_68;
      } while (iVar14 < (int)(float)local_48);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static slice_instructions get_slice_instructions(struct clip_ctx * ctx, const clip_image_size & original_size) {
        slice_instructions res;
        const int patch_size      = clip_get_patch_size(ctx);
        const int slice_size      = clip_get_image_size(ctx);
        const int max_slice_nums  = get_max_slices(ctx);
        const int original_width  = original_size.width;
        const int original_height = original_size.height;
        const float log_ratio = log((float)original_width / original_height);
        const float ratio = (float)original_width * original_height / (slice_size * slice_size);
        const int multiple = fmin(ceil(ratio), max_slice_nums);
        const bool has_slices = (multiple > 1);
        const bool has_pinpoints = !ctx->vision_model.hparams.image_grid_pinpoints.empty();

        if (has_pinpoints) {
            // has pinpoints, use them to calculate the grid size (e.g. llava-1.6)
            auto refine_size = llava_uhd::select_best_resolution(
                ctx->vision_model.hparams.image_grid_pinpoints,
                original_size);
            res.overview_size   = clip_image_size{slice_size, slice_size};
            res.refined_size    = refine_size;
            res.grid_size       = clip_image_size{0, 0};
            res.padding_refined = true;

            for (int y = 0; y < refine_size.height; y += slice_size) {
                for (int x = 0; x < refine_size.width; x += slice_size) {
                    slice_coordinates slice;
                    slice.x = x;
                    slice.y = y;
                    slice.size.width  = std::min(slice_size, refine_size.width  - x);
                    slice.size.height = std::min(slice_size, refine_size.height - y);
                    res.slices.push_back(slice);
                    if (x == 0) {
                        res.grid_size.width++;
                    }
                }
                res.grid_size.height++;
            }

            return res;
        }

        // no pinpoints, dynamically calculate the grid size (e.g. minicpmv)

        auto best_size    = get_best_resize(original_size, slice_size, patch_size, has_slices);
        res.overview_size = best_size;

        if (!has_slices) {
            // skip slicing logic
            res.refined_size = clip_image_size{0, 0};
            res.grid_size    = clip_image_size{0, 0};

        } else {
            auto best_grid   = get_best_grid(max_slice_nums, multiple, log_ratio);
            auto refine_size = get_refine_size(original_size, best_grid, slice_size, patch_size, true);
            res.grid_size    = best_grid;
            res.refined_size = refine_size;

            int width  = refine_size.width;
            int height = refine_size.height;
            int grid_x = int(width  / best_grid.width);
            int grid_y = int(height / best_grid.height);
            for (int patches_y = 0,                    ic = 0;
                    patches_y < refine_size.height && ic < best_grid.height;
                    patches_y += grid_y,              ic += 1) {
                for (int patches_x = 0,                   jc = 0;
                        patches_x < refine_size.width && jc < best_grid.width;
                        patches_x += grid_x,             jc += 1) {
                    slice_coordinates slice;
                    slice.x = patches_x;
                    slice.y = patches_y;
                    slice.size.width  = grid_x;
                    slice.size.height = grid_y;
                    res.slices.push_back(slice);
                    // LOG_INF("slice %d: %d %d %d %d\n", ic, patches_i, patches_j, grid_x, grid_y);
                }
            }
        }

        return res;
    }